

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibPrint(Sfm_Lib_t *p)

{
  int iVar1;
  uint uVar2;
  int i_00;
  Sfm_Fun_t *pObj_00;
  bool bVar3;
  uint local_24;
  int nFanins;
  int i;
  word *pTruth;
  Sfm_Fun_t *pObj;
  Sfm_Lib_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_MemEntryNum(p->vTtMem);
    bVar3 = false;
    if ((int)local_24 < iVar1) {
      _nFanins = Vec_MemReadEntry(p->vTtMem,local_24);
      bVar3 = _nFanins != (word *)0x0;
    }
    if (!bVar3) break;
    if ((1 < (int)local_24) && (iVar1 = Vec_IntEntry(&p->vHits,local_24), iVar1 != 0)) {
      iVar1 = Abc_TtSupportSize(_nFanins,p->nVars);
      printf("%8d : ",(ulong)local_24);
      uVar2 = Vec_IntEntry(&p->vCounts,local_24);
      printf("Num =%5d  ",(ulong)uVar2);
      uVar2 = Vec_IntEntry(&p->vHits,local_24);
      printf("Hit =%4d  ",(ulong)uVar2);
      i_00 = Vec_IntEntry(&p->vLists,local_24);
      pObj_00 = Sfm_LibFun(p,i_00);
      if (pObj_00 != (Sfm_Fun_t *)0x0) {
        Sfm_LibPrintObj(p,pObj_00);
      }
      printf("    ");
      Dau_DsdPrintFromTruth(_nFanins,iVar1);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Sfm_LibPrint( Sfm_Lib_t * p )
{
    Sfm_Fun_t * pObj; word * pTruth; int i, nFanins;   
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
    {
        if ( i < 2 || Vec_IntEntry(&p->vHits, i) == 0 )
            continue;
        nFanins = Abc_TtSupportSize(pTruth, p->nVars);
        printf( "%8d : ", i );
        printf( "Num =%5d  ", Vec_IntEntry(&p->vCounts, i) );
        printf( "Hit =%4d  ", Vec_IntEntry(&p->vHits, i) );
        Sfm_LibForEachSuper( p, pObj, i )
        {
            Sfm_LibPrintObj( p, pObj );
            break;
        }
        printf( "    " );
        Dau_DsdPrintFromTruth( pTruth, nFanins );
    }
}